

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O3

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  int iVar1;
  NullLog *pNVar2;
  short sourcePort_00;
  short port_00;
  bool bVar3;
  socket_handle s_00;
  Session *pSVar4;
  long *plVar5;
  undefined8 *puVar6;
  ThreadedSocketConnection *this_00;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  undefined8 uVar10;
  NullLog *pLog;
  Log *pLVar11;
  short sourcePort;
  short port;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string sourceAddress;
  string address;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  thread_id thread;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar4 = Session::lookupSession(s);
  DateTime::nowUtc();
  sourceAddress.field_2._M_allocated_capacity =
       (ulong)(uint7)address.field_2._M_allocated_capacity._1_7_ << 8;
  sourceAddress._M_string_length = address._M_string_length;
  sourceAddress._M_dataplus._M_p = (pointer)&PTR__DateTime_001ea8f0;
  bVar3 = TimeRange::isInRange(&pSVar4->m_sessionTime,(UtcTimeStamp *)&sourceAddress);
  if (!bVar3) {
    return;
  }
  address._M_dataplus._M_p = (pointer)&address.field_2;
  address._M_string_length = 0;
  address.field_2._M_local_buf[0] = '\0';
  port = 0;
  sourceAddress._M_dataplus._M_p = (pointer)&sourceAddress.field_2;
  sourceAddress._M_string_length = 0;
  sourceAddress.field_2._M_allocated_capacity =
       sourceAddress.field_2._M_allocated_capacity & 0xffffffffffffff00;
  sourcePort = 0;
  getHost(this,s,d,&address,&port,&sourceAddress,&sourcePort);
  s_00 = socket_createConnector();
  if (this->m_noDelay == true) {
    socket_setsockopt(s_00,1);
  }
  if (this->m_sendBufSize != 0) {
    socket_setsockopt(s_00,7,this->m_sendBufSize);
  }
  if (this->m_rcvBufSize != 0) {
    socket_setsockopt(s_00,8,this->m_rcvBufSize);
  }
  Initiator::setPending(&this->super_Initiator,s);
  std::operator+(&local_50,"Connecting to ",&address);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  port_00 = port;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_1a0 = *puVar7;
    lStack_198 = plVar5[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar7;
    local_1b0 = (ulong *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  IntConvertor::convert_abi_cxx11_
            (&local_d0,(IntConvertor *)(ulong)(ushort)port,(signed_int)local_1a8);
  uVar9 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar9 = local_1a0;
  }
  if (uVar9 < local_d0._M_string_length + local_1a8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_d0._M_string_length + local_1a8) goto LAB_001b8a36;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001b8a36:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_190 = &local_180;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_180 = *plVar5;
    uStack_178 = puVar6[3];
  }
  else {
    local_180 = *plVar5;
    local_190 = (long *)*puVar6;
  }
  local_188 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_b0 = &local_a0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)sourceAddress._M_dataplus._M_p);
  local_90 = &local_80;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  sourcePort_00 = sourcePort;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar5[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  IntConvertor::convert_abi_cxx11_
            (&local_f0,(IntConvertor *)(ulong)(ushort)sourcePort,(signed_int)local_148);
  uVar9 = 0xf;
  if (local_150 != &local_140) {
    uVar9 = local_140;
  }
  if (uVar9 < local_f0._M_string_length + local_148) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar10 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_148 <= (ulong)uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_150);
      goto LAB_001b8c4e;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
LAB_001b8c4e:
  local_170 = &local_160;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_160 = *plVar5;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*puVar6;
  }
  local_168 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pLVar11 = &(pSVar4->m_state).super_Log;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    uStack_58 = (undefined4)plVar5[3];
    uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
    thread = (thread_id)&local_60;
  }
  else {
    local_60 = *plVar8;
    thread = (thread_id)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*pLVar11->_vptr_Log[6])(pLVar11);
  if ((long *)thread != &local_60) {
    operator_delete((void *)thread,local_60 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = (ThreadedSocketConnection *)operator_new(0x2148);
  pNVar2 = (NullLog *)(this->super_Initiator).m_pLog;
  pLog = &(this->super_Initiator).m_nullLog;
  if (pNVar2 != (NullLog *)0x0) {
    pLog = pNVar2;
  }
  ThreadedSocketConnection::ThreadedSocketConnection
            (this_00,s,s_00,&address,port_00,&pLog->super_Log,&sourceAddress,sourcePort_00);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = this;
  puVar6[1] = this_00;
  Mutex::lock(&this->m_mutex);
  bVar3 = thread_spawn(socketThread,puVar6,&thread);
  if (bVar3) {
    addThread(this,s_00,thread);
  }
  else {
    operator_delete(puVar6,0x10);
    (*(this_00->super_Responder)._vptr_Responder[3])(this_00);
    (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
    Initiator::setDisconnected(&this->super_Initiator,s);
  }
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceAddress._M_dataplus._M_p != &sourceAddress.field_2) {
    operator_delete(sourceAddress._M_dataplus._M_p,sourceAddress.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)address._M_dataplus._M_p != &address.field_2) {
    operator_delete(address._M_dataplus._M_p,
                    CONCAT71(address.field_2._M_allocated_capacity._1_7_,
                             address.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;
    getHost( s, d, address, port, sourceAddress, sourcePort );

    socket_handle socket = socket_createConnector();
    if( m_noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( m_sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, m_sendBufSize );
    if( m_rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, m_rcvBufSize );

    setPending( s );
    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");

    ThreadedSocketConnection* pConnection =
      new ThreadedSocketConnection( s, socket, address, port, getLog(), sourceAddress, sourcePort );

    ThreadPair* pair = new ThreadPair( this, pConnection );

    {
      Locker l( m_mutex );
      thread_id thread;
      if ( thread_spawn( &socketThread, pair, thread ) )
      {
        addThread( socket, thread );
      }
      else
      {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected( s );
      }
    }
  }
  catch ( std::exception& ) {}
}